

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O0

void __thiscall bintree::updateOnce(bintree *this,vec2 *target)

{
  leb_DiamondParent diamond_00;
  leb_DiamondParent diamond_01;
  bool bVar1;
  byte local_d1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  leb_Node local_b0;
  leb_Node local_a8;
  leb_Node local_a0;
  leb_Node local_98;
  leb_Node local_90;
  leb_Node local_88;
  byte local_7d;
  leb_Node lStack_7c;
  bool shouldMerge;
  leb_DiamondParent local_74;
  leb_Node local_64;
  leb_DiamondParent local_5c;
  leb_Node local_4c;
  leb_DiamondParent diamond;
  leb_Node lStack_28;
  bool isInside;
  leb_Node node;
  uint32_t i;
  uint32_t cnt;
  vec2 *target_local;
  bintree *this_local;
  
  node.depth = leb_NodeCount(this->m_leb);
  for (node.id = 0; node.id < (uint)node.depth; node.id = node.id + 1) {
    lStack_28 = leb_DecodeNode(this->m_leb,node.id);
    if ((this->m_pingPong == 0) && ((g_params.flags.freeze & 1U) == 0)) {
      bVar1 = testTarget(this,&stack0xffffffffffffffd8,target);
      if (bVar1) {
        if (g_params.mode == 0) {
          leb_SplitNodeConforming(this->m_leb,lStack_28);
        }
        else {
          diamond.top = lStack_28;
          leb_SplitNodeConforming_Quad(this->m_leb,lStack_28);
        }
      }
    }
    else if ((this->m_pingPong == 1) && ((g_params.flags.freeze & 1U) == 0)) {
      if (g_params.mode == 0) {
        local_64 = lStack_28;
        local_5c = leb_DecodeDiamondParent(lStack_28);
        local_4c = local_5c.base;
        diamond.base = local_5c.top;
      }
      else {
        lStack_7c = lStack_28;
        local_74 = leb_DecodeDiamondParent_Quad(lStack_28);
        local_4c = local_74.base;
        diamond.base = local_74.top;
      }
      bVar1 = testTarget(this,&local_4c,target);
      local_d1 = 0;
      if (!bVar1) {
        bVar1 = testTarget(this,&diamond.base,target);
        local_d1 = bVar1 ^ 0xff;
      }
      local_7d = local_d1 & 1;
      if (local_7d != 0) {
        if (g_params.mode == 0) {
          local_88 = lStack_28;
          local_98 = local_4c;
          local_90 = diamond.base;
          diamond_01.top = diamond.base;
          diamond_01.base = local_4c;
          leb_MergeNodeConforming(this->m_leb,lStack_28,diamond_01);
        }
        else {
          local_a0 = lStack_28;
          local_b0 = local_4c;
          local_a8 = diamond.base;
          diamond_00.top = diamond.base;
          diamond_00.base = local_4c;
          leb_MergeNodeConforming_Quad(this->m_leb,lStack_28,diamond_00);
        }
      }
    }
  }
  leb_ComputeSumReduction(this->m_leb);
  precomputeNodes(&local_c8,this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_c8);
  this->m_pingPong = 1 - this->m_pingPong;
  return;
}

Assistant:

void updateOnce(const dja::vec2 &target)
    {
        uint32_t cnt = leb_NodeCount(m_leb);

        // update
        for (uint32_t i = 0; i < cnt; ++i) {
            leb_Node node = leb_DecodeNode(m_leb, i);

            if /* splitting pass */(m_pingPong == 0 && !g_params.flags.freeze) {
                bool isInside = testTarget(node, target);

                /* split */
                if (isInside) {
                    if (g_params.mode == MODE_TRIANGLE) {
                        leb_SplitNodeConforming(m_leb, node);
                    } else {
                        leb_SplitNodeConforming_Quad(m_leb, node);
                    }
                }
            } else if /* merging pass */(m_pingPong == 1 && !g_params.flags.freeze) {
                leb_DiamondParent diamond;

                if (g_params.mode == MODE_TRIANGLE) {
                    diamond = leb_DecodeDiamondParent(node);
                } else {
                    diamond = leb_DecodeDiamondParent_Quad(node);
                }

                bool shouldMerge = !testTarget(diamond.base, target)
                                 && !testTarget(diamond.top, target);

                if (shouldMerge) {
                    if (g_params.mode == MODE_TRIANGLE) {
                        leb_MergeNodeConforming(m_leb, node, diamond);
                    } else {
                        leb_MergeNodeConforming_Quad(m_leb, node, diamond);
                    }
                }
            }
        }

        leb_ComputeSumReduction(m_leb);

        precomputeNodes();
        m_pingPong = 1 - m_pingPong;
    }